

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeStorage(ImGuiStorage *storage,char *label)

{
  uint uVar1;
  bool bVar2;
  ImGuiStoragePair *pIVar3;
  int n;
  int i;
  
  uVar1 = (storage->Data).Size;
  bVar2 = TreeNode(label,"%s: %d entries, %d bytes",label,(ulong)uVar1,(ulong)(uVar1 << 4));
  if (bVar2) {
    for (i = 0; i < (storage->Data).Size; i = i + 1) {
      pIVar3 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[](&storage->Data,i);
      BulletText("Key 0x%08X Value { i: %d }",(ulong)pIVar3->key,
                 (ulong)(uint)(pIVar3->field_1).val_i);
    }
    TreePop();
    return;
  }
  return;
}

Assistant:

void ImGui::DebugNodeStorage(ImGuiStorage* storage, const char* label)
{
    if (!TreeNode(label, "%s: %d entries, %d bytes", label, storage->Data.Size, storage->Data.size_in_bytes()))
        return;
    for (int n = 0; n < storage->Data.Size; n++)
    {
        const ImGuiStorage::ImGuiStoragePair& p = storage->Data[n];
        BulletText("Key 0x%08X Value { i: %d }", p.key, p.val_i); // Important: we currently don't store a type, real value may not be integer.
    }
    TreePop();
}